

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktGeometryBasicClass.cpp
# Opt level: O2

TestStatus * __thiscall
vkt::geometry::GeometryExpanderRenderTestInstance::iterate
          (TestStatus *__return_storage_ptr__,GeometryExpanderRenderTestInstance *this)

{
  undefined8 *puVar1;
  undefined8 *puVar2;
  pointer pVVar3;
  pointer pVVar4;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>_>
  *container;
  ProgramCollection<vk::ProgramBinary> *pPVar5;
  void *pvVar6;
  Context *context;
  undefined8 uVar7;
  VkImageSubresourceRange subresourceRange;
  VkImageSubresourceRange subresourceRange_00;
  VkImageSubresourceRange subresourceRange_01;
  bool bVar8;
  deUint32 dVar9;
  VkBool32 VVar10;
  int iVar11;
  DeviceInterface *vk;
  VkDevice device;
  VkQueue queue;
  Allocator *allocator;
  InstanceInterface *vki;
  VkPhysicalDevice physDevice;
  ProgramBinary *pPVar12;
  GraphicsPipelineBuilder *pGVar13;
  TextureFormat format;
  long lVar14;
  int iVar15;
  char *__s;
  VkDeviceSize bufferSize;
  long lVar16;
  VkImageMemoryBarrier *this_00;
  VkDeviceSize bufferSize_00;
  VkImageSubresourceLayers subresourceLayers;
  VkExtent3D extent;
  VkVertexInputAttributeDescription vertexAttribute;
  allocator<char> local_399;
  IVec2 resolution;
  allocator<char> local_389;
  RefBase<vk::VkCommandBuffer_s_*> local_388;
  long local_368;
  Allocator *local_360;
  VkDeviceSize offsets [1];
  RefBase<vk::Handle<(vk::HandleType)17>_> local_328;
  Buffer vertexBuffer;
  Buffer colorBuffer;
  RefBase<vk::Handle<(vk::HandleType)18>_> local_248;
  RefBase<vk::Handle<(vk::HandleType)24>_> local_228;
  RefBase<vk::Handle<(vk::HandleType)23>_> local_208;
  RefBase<vk::Handle<(vk::HandleType)13>_> local_1e8;
  Move<vk::Handle<(vk::HandleType)16>_> pipelineLayout;
  Image colorAttachmentImage;
  VkImageMemoryBarrier colorAttachmentLayoutBarrier;
  string local_70;
  string geometryShaderName;
  
  vk = Context::getDeviceInterface((this->super_TestInstance).m_context);
  device = Context::getDevice((this->super_TestInstance).m_context);
  dVar9 = Context::getUniversalQueueFamilyIndex((this->super_TestInstance).m_context);
  local_368 = CONCAT44(local_368._4_4_,dVar9);
  queue = Context::getUniversalQueue((this->super_TestInstance).m_context);
  allocator = Context::getDefaultAllocator((this->super_TestInstance).m_context);
  resolution.m_data[0] = 0x100;
  resolution.m_data[1] = 0x100;
  makeImageCreateInfo((VkImageCreateInfo *)&colorAttachmentLayoutBarrier,&resolution,
                      VK_FORMAT_R8G8B8A8_UNORM,0x11,1);
  local_360 = allocator;
  Image::Image(&colorAttachmentImage,vk,device,allocator,
               (VkImageCreateInfo *)&colorAttachmentLayoutBarrier,(MemoryRequirement)0x0);
  makeRenderPass((Move<vk::Handle<(vk::HandleType)17>_> *)&colorAttachmentLayoutBarrier,vk,device,
                 VK_FORMAT_R8G8B8A8_UNORM);
  local_328.m_data.deleter.m_device = (VkDevice)colorAttachmentLayoutBarrier._16_8_;
  local_328.m_data.deleter.m_allocator =
       (VkAllocationCallbacks *)colorAttachmentLayoutBarrier._24_8_;
  local_328.m_data.object.m_internal = colorAttachmentLayoutBarrier._0_8_;
  local_328.m_data.deleter.m_deviceIface = (DeviceInterface *)colorAttachmentLayoutBarrier.pNext;
  colorAttachmentLayoutBarrier.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
  colorAttachmentLayoutBarrier._4_4_ = 0;
  colorAttachmentLayoutBarrier.pNext = (void *)0x0;
  colorAttachmentLayoutBarrier.srcAccessMask = 0;
  colorAttachmentLayoutBarrier.dstAccessMask = 0;
  colorAttachmentLayoutBarrier.oldLayout = VK_IMAGE_LAYOUT_UNDEFINED;
  colorAttachmentLayoutBarrier.newLayout = VK_IMAGE_LAYOUT_UNDEFINED;
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)17>_>::~RefBase
            ((RefBase<vk::Handle<(vk::HandleType)17>_> *)&colorAttachmentLayoutBarrier);
  (*(this->super_TestInstance)._vptr_TestInstance[3])(&pipelineLayout,this,vk,device);
  subresourceRange.levelCount = 1;
  subresourceRange.aspectMask = 1;
  subresourceRange.baseMipLevel = 0;
  subresourceRange.baseArrayLayer = 0;
  subresourceRange.layerCount = 1;
  makeImageView((Move<vk::Handle<(vk::HandleType)13>_> *)&colorAttachmentLayoutBarrier,vk,device,
                (VkImage)colorAttachmentImage.m_image.super_RefBase<vk::Handle<(vk::HandleType)9>_>.
                         m_data.object.m_internal,VK_IMAGE_VIEW_TYPE_2D,VK_FORMAT_R8G8B8A8_UNORM,
                subresourceRange);
  local_1e8.m_data.deleter.m_device = (VkDevice)colorAttachmentLayoutBarrier._16_8_;
  local_1e8.m_data.deleter.m_allocator =
       (VkAllocationCallbacks *)colorAttachmentLayoutBarrier._24_8_;
  local_1e8.m_data.object.m_internal = colorAttachmentLayoutBarrier._0_8_;
  local_1e8.m_data.deleter.m_deviceIface = (DeviceInterface *)colorAttachmentLayoutBarrier.pNext;
  colorAttachmentLayoutBarrier.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
  colorAttachmentLayoutBarrier._4_4_ = 0;
  colorAttachmentLayoutBarrier.pNext = (void *)0x0;
  colorAttachmentLayoutBarrier.srcAccessMask = 0;
  colorAttachmentLayoutBarrier.dstAccessMask = 0;
  colorAttachmentLayoutBarrier.oldLayout = VK_IMAGE_LAYOUT_UNDEFINED;
  colorAttachmentLayoutBarrier.newLayout = VK_IMAGE_LAYOUT_UNDEFINED;
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)13>_>::~RefBase
            ((RefBase<vk::Handle<(vk::HandleType)13>_> *)&colorAttachmentLayoutBarrier);
  makeFramebuffer((Move<vk::Handle<(vk::HandleType)23>_> *)&colorAttachmentLayoutBarrier,vk,device,
                  (VkRenderPass)local_328.m_data.object.m_internal,
                  (VkImageView)local_1e8.m_data.object.m_internal,resolution.m_data[0],
                  resolution.m_data[1],1);
  local_208.m_data.deleter.m_device = (VkDevice)colorAttachmentLayoutBarrier._16_8_;
  local_208.m_data.deleter.m_allocator =
       (VkAllocationCallbacks *)colorAttachmentLayoutBarrier._24_8_;
  local_208.m_data.object.m_internal = colorAttachmentLayoutBarrier._0_8_;
  local_208.m_data.deleter.m_deviceIface = (DeviceInterface *)colorAttachmentLayoutBarrier.pNext;
  colorAttachmentLayoutBarrier.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
  colorAttachmentLayoutBarrier._4_4_ = 0;
  colorAttachmentLayoutBarrier.pNext = (void *)0x0;
  colorAttachmentLayoutBarrier.srcAccessMask = 0;
  colorAttachmentLayoutBarrier.dstAccessMask = 0;
  colorAttachmentLayoutBarrier.oldLayout = VK_IMAGE_LAYOUT_UNDEFINED;
  colorAttachmentLayoutBarrier.newLayout = VK_IMAGE_LAYOUT_UNDEFINED;
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)23>_>::~RefBase
            ((RefBase<vk::Handle<(vk::HandleType)23>_> *)&colorAttachmentLayoutBarrier);
  ::vk::createCommandPool
            ((Move<vk::Handle<(vk::HandleType)24>_> *)&colorAttachmentLayoutBarrier,vk,device,2,
             (deUint32)local_368,(VkAllocationCallbacks *)0x0);
  local_228.m_data.deleter.m_device = (VkDevice)colorAttachmentLayoutBarrier._16_8_;
  local_228.m_data.deleter.m_allocator =
       (VkAllocationCallbacks *)colorAttachmentLayoutBarrier._24_8_;
  local_228.m_data.object.m_internal = colorAttachmentLayoutBarrier._0_8_;
  local_228.m_data.deleter.m_deviceIface = (DeviceInterface *)colorAttachmentLayoutBarrier.pNext;
  colorAttachmentLayoutBarrier.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
  colorAttachmentLayoutBarrier._4_4_ = 0;
  colorAttachmentLayoutBarrier.pNext = (void *)0x0;
  colorAttachmentLayoutBarrier.srcAccessMask = 0;
  colorAttachmentLayoutBarrier.dstAccessMask = 0;
  colorAttachmentLayoutBarrier.oldLayout = VK_IMAGE_LAYOUT_UNDEFINED;
  colorAttachmentLayoutBarrier.newLayout = VK_IMAGE_LAYOUT_UNDEFINED;
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)24>_>::~RefBase
            ((RefBase<vk::Handle<(vk::HandleType)24>_> *)&colorAttachmentLayoutBarrier);
  ::vk::allocateCommandBuffer
            ((Move<vk::VkCommandBuffer_s_*> *)&colorAttachmentLayoutBarrier,vk,device,
             (VkCommandPool)local_228.m_data.object.m_internal,VK_COMMAND_BUFFER_LEVEL_PRIMARY);
  local_388.m_data.deleter.m_device = (VkDevice)colorAttachmentLayoutBarrier._16_8_;
  local_388.m_data.deleter.m_pool.m_internal._0_4_ = colorAttachmentLayoutBarrier.oldLayout;
  local_388.m_data.deleter.m_pool.m_internal._4_4_ = colorAttachmentLayoutBarrier.newLayout;
  local_388.m_data.object = (VkCommandBuffer_s *)colorAttachmentLayoutBarrier._0_8_;
  local_388.m_data.deleter.m_deviceIface = (DeviceInterface *)colorAttachmentLayoutBarrier.pNext;
  colorAttachmentLayoutBarrier.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
  colorAttachmentLayoutBarrier._4_4_ = 0;
  colorAttachmentLayoutBarrier.pNext = (void *)0x0;
  colorAttachmentLayoutBarrier.srcAccessMask = 0;
  colorAttachmentLayoutBarrier.dstAccessMask = 0;
  colorAttachmentLayoutBarrier.oldLayout = VK_IMAGE_LAYOUT_UNDEFINED;
  colorAttachmentLayoutBarrier.newLayout = VK_IMAGE_LAYOUT_UNDEFINED;
  ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::~RefBase
            ((RefBase<vk::VkCommandBuffer_s_*> *)&colorAttachmentLayoutBarrier);
  pVVar3 = (this->m_vertexAttrData).
           super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  local_368 = (long)(this->m_vertexPosData).
                    super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish -
              (long)(this->m_vertexPosData).
                    super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
  pVVar4 = (this->m_vertexAttrData).
           super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
           _M_impl.super__Vector_impl_data._M_start;
  container = &((this->super_TestInstance).m_context)->m_progCollection->m_programs;
  __s = "geometry_pointsize";
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&colorAttachmentLayoutBarrier,"geometry_pointsize",
             (allocator<char> *)&colorBuffer);
  bVar8 = de::
          contains<std::map<std::__cxx11::string,vk::ProgramBinary*,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,vk::ProgramBinary*>>>>
                    (container,(key_type *)&colorAttachmentLayoutBarrier);
  if (bVar8) {
    vki = Context::getInstanceInterface((this->super_TestInstance).m_context);
    physDevice = Context::getPhysicalDevice((this->super_TestInstance).m_context);
    VVar10 = checkPointSize(vki,physDevice);
    if (VVar10 == 0) {
      __s = "geometry";
    }
  }
  else {
    __s = "geometry";
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&geometryShaderName,__s,(allocator<char> *)&vertexBuffer);
  std::__cxx11::string::~string((string *)&colorAttachmentLayoutBarrier);
  memset(&colorAttachmentLayoutBarrier.pNext,0,0xf4);
  colorAttachmentLayoutBarrier.sType = resolution.m_data[0];
  colorAttachmentLayoutBarrier._4_4_ = resolution.m_data[1];
  pPVar5 = ((this->super_TestInstance).m_context)->m_progCollection;
  std::__cxx11::string::string<std::allocator<char>>((string *)&vertexBuffer,"vertex",&local_399);
  pPVar12 = ::vk::ProgramCollection<vk::ProgramBinary>::get(pPVar5,(string *)&vertexBuffer);
  pGVar13 = GraphicsPipelineBuilder::setShader
                      ((GraphicsPipelineBuilder *)&colorAttachmentLayoutBarrier,vk,device,
                       VK_SHADER_STAGE_VERTEX_BIT,pPVar12,(VkSpecializationInfo *)0x0);
  pPVar12 = ::vk::ProgramCollection<vk::ProgramBinary>::get
                      (((this->super_TestInstance).m_context)->m_progCollection,&geometryShaderName)
  ;
  pGVar13 = GraphicsPipelineBuilder::setShader
                      (pGVar13,vk,device,VK_SHADER_STAGE_GEOMETRY_BIT,pPVar12,
                       (VkSpecializationInfo *)0x0);
  pPVar5 = ((this->super_TestInstance).m_context)->m_progCollection;
  std::__cxx11::string::string<std::allocator<char>>((string *)offsets,"fragment",&local_389);
  pPVar12 = ::vk::ProgramCollection<vk::ProgramBinary>::get(pPVar5,(string *)offsets);
  pGVar13 = GraphicsPipelineBuilder::setShader
                      (pGVar13,vk,device,VK_SHADER_STAGE_FRAGMENT_BIT,pPVar12,
                       (VkSpecializationInfo *)0x0);
  pGVar13 = GraphicsPipelineBuilder::addVertexBinding
                      (pGVar13,(VkVertexInputBindingDescription)ZEXT812(0x2000000000));
  pGVar13 = GraphicsPipelineBuilder::addVertexAttribute
                      (pGVar13,(VkVertexInputAttributeDescription)(ZEXT816(0x6d) << 0x40));
  vertexAttribute.format = VK_FORMAT_R32G32B32A32_SFLOAT;
  vertexAttribute.offset = 0x10;
  vertexAttribute.location = 1;
  vertexAttribute.binding = 0;
  pGVar13 = GraphicsPipelineBuilder::addVertexAttribute(pGVar13,vertexAttribute);
  pGVar13->m_primitiveTopology = this->m_primitiveType;
  GraphicsPipelineBuilder::build
            ((Move<vk::Handle<(vk::HandleType)18>_> *)&colorBuffer,pGVar13,vk,device,
             (VkPipelineLayout)
             pipelineLayout.super_RefBase<vk::Handle<(vk::HandleType)16>_>.m_data.object.m_internal,
             (VkRenderPass)local_328.m_data.object.m_internal);
  local_248.m_data.deleter.m_device =
       colorBuffer.m_buffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter.m_device;
  local_248.m_data.deleter.m_allocator =
       colorBuffer.m_buffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter.m_allocator
  ;
  local_248.m_data.object.m_internal =
       colorBuffer.m_buffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.object.m_internal;
  local_248.m_data.deleter.m_deviceIface =
       colorBuffer.m_buffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter.
       m_deviceIface;
  colorBuffer.m_buffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.object.m_internal = 0;
  colorBuffer.m_buffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter.m_deviceIface =
       (DeviceInterface *)0x0;
  colorBuffer.m_buffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter.m_device =
       (VkDevice)0x0;
  colorBuffer.m_buffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter.m_allocator =
       (VkAllocationCallbacks *)0x0;
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)18>_>::~RefBase
            ((RefBase<vk::Handle<(vk::HandleType)18>_> *)&colorBuffer);
  std::__cxx11::string::~string((string *)offsets);
  std::__cxx11::string::~string((string *)&vertexBuffer);
  GraphicsPipelineBuilder::~GraphicsPipelineBuilder
            ((GraphicsPipelineBuilder *)&colorAttachmentLayoutBarrier);
  iVar15 = resolution.m_data[1] * resolution.m_data[0];
  format = ::vk::mapVkFormat(VK_FORMAT_R8G8B8A8_UNORM);
  iVar11 = tcu::getPixelSize(format);
  bufferSize = (VkDeviceSize)(iVar15 * iVar11);
  makeBufferCreateInfo((VkBufferCreateInfo *)&colorAttachmentLayoutBarrier,bufferSize,2);
  geometry::Buffer::Buffer
            (&colorBuffer,vk,device,local_360,(VkBufferCreateInfo *)&colorAttachmentLayoutBarrier,
             (MemoryRequirement)0x1);
  bufferSize_00 = (long)pVVar3 + (local_368 - (long)pVVar4);
  makeBufferCreateInfo((VkBufferCreateInfo *)&colorAttachmentLayoutBarrier,bufferSize_00,0x80);
  geometry::Buffer::Buffer
            (&vertexBuffer,vk,device,local_360,(VkBufferCreateInfo *)&colorAttachmentLayoutBarrier,
             (MemoryRequirement)0x1);
  pvVar6 = (vertexBuffer.m_allocation.
            super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data.ptr)->
           m_hostPtr;
  lVar14 = 0;
  for (lVar16 = 0; lVar16 < this->m_numDrawVertices; lVar16 = lVar16 + 1) {
    puVar1 = (undefined8 *)
             ((long)((this->m_vertexPosData).
                     super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                     ._M_impl.super__Vector_impl_data._M_start)->m_data + lVar14);
    uVar7 = puVar1[1];
    puVar2 = (undefined8 *)((long)pvVar6 + lVar14 * 2);
    *puVar2 = *puVar1;
    puVar2[1] = uVar7;
    puVar1 = (undefined8 *)
             ((long)((this->m_vertexAttrData).
                     super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                     ._M_impl.super__Vector_impl_data._M_start)->m_data + lVar14);
    uVar7 = puVar1[1];
    puVar2 = (undefined8 *)((long)pvVar6 + lVar14 * 2 + 0x10);
    *puVar2 = *puVar1;
    puVar2[1] = uVar7;
    lVar14 = lVar14 + 0x10;
  }
  ::vk::flushMappedMemoryRange
            (vk,device,
             (VkDeviceMemory)
             ((vertexBuffer.m_allocation.
               super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data.ptr)->
             m_memory).m_internal,
             (vertexBuffer.m_allocation.
              super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data.ptr)->
             m_offset,bufferSize_00);
  beginCommandBuffer(vk,local_388.m_data.object);
  subresourceRange_00.levelCount = 1;
  subresourceRange_00.aspectMask = 1;
  subresourceRange_00.baseMipLevel = 0;
  subresourceRange_00.baseArrayLayer = 0;
  subresourceRange_00.layerCount = 1;
  makeImageMemoryBarrier
            (&colorAttachmentLayoutBarrier,0,0x100,VK_IMAGE_LAYOUT_UNDEFINED,
             VK_IMAGE_LAYOUT_COLOR_ATTACHMENT_OPTIMAL,
             (VkImage)colorAttachmentImage.m_image.super_RefBase<vk::Handle<(vk::HandleType)9>_>.
                      m_data.object.m_internal,subresourceRange_00);
  (*vk->_vptr_DeviceInterface[0x6d])
            (vk,local_388.m_data.object,1,0x80,0,0,0,0,0,1,&colorAttachmentLayoutBarrier);
  colorAttachmentLayoutBarrier.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
  colorAttachmentLayoutBarrier._4_4_ = 0;
  colorAttachmentLayoutBarrier.pNext = (void *)resolution.m_data;
  offsets[0] = 0;
  beginRenderPass(vk,local_388.m_data.object,(VkRenderPass)local_328.m_data.object.m_internal,
                  (VkFramebuffer)local_208.m_data.object.m_internal,
                  (VkRect2D *)&colorAttachmentLayoutBarrier,(Vec4 *)offsets);
  (*vk->_vptr_DeviceInterface[0x4c])
            (vk,local_388.m_data.object,0,local_248.m_data.object.m_internal);
  offsets[0] = 0;
  colorAttachmentLayoutBarrier._0_8_ =
       vertexBuffer.m_buffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.object.m_internal;
  (*vk->_vptr_DeviceInterface[0x58])(vk,local_388.m_data.object,0,1);
  (*(this->super_TestInstance)._vptr_TestInstance[4])
            (this,vk,device,local_360,&local_388,&pipelineLayout);
  (*(this->super_TestInstance)._vptr_TestInstance[5])(this,&local_388);
  endRenderPass(vk,local_388.m_data.object);
  subresourceRange_01.levelCount = 1;
  subresourceRange_01.aspectMask = 1;
  subresourceRange_01.baseMipLevel = 0;
  subresourceRange_01.baseArrayLayer = 0;
  subresourceRange_01.layerCount = 1;
  makeImageMemoryBarrier
            (&colorAttachmentLayoutBarrier,0x100,0x800,VK_IMAGE_LAYOUT_COLOR_ATTACHMENT_OPTIMAL,
             VK_IMAGE_LAYOUT_TRANSFER_SRC_OPTIMAL,
             (VkImage)colorAttachmentImage.m_image.super_RefBase<vk::Handle<(vk::HandleType)9>_>.
                      m_data.object.m_internal,subresourceRange_01);
  (*vk->_vptr_DeviceInterface[0x6d])
            (vk,local_388.m_data.object,0x400,0x1000,0,0,0,0,0,1,&colorAttachmentLayoutBarrier);
  subresourceLayers.baseArrayLayer = 0;
  subresourceLayers.layerCount = 1;
  subresourceLayers.aspectMask = 1;
  subresourceLayers.mipLevel = 0;
  extent.depth = 1;
  extent.width = resolution.m_data[0];
  extent.height = resolution.m_data[1];
  makeBufferImageCopy((VkBufferImageCopy *)&colorAttachmentLayoutBarrier,extent,subresourceLayers);
  (*vk->_vptr_DeviceInterface[99])
            (vk,local_388.m_data.object,
             colorAttachmentImage.m_image.super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.
             object.m_internal,6,
             colorBuffer.m_buffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.object.
             m_internal,1,(int)&colorAttachmentLayoutBarrier);
  makeBufferMemoryBarrier
            ((VkBufferMemoryBarrier *)&colorAttachmentLayoutBarrier,0x1000,0x2000,
             (VkBuffer)
             colorBuffer.m_buffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.object.
             m_internal,0,bufferSize);
  (*vk->_vptr_DeviceInterface[0x6d])
            (vk,local_388.m_data.object,0x1000,0x4000,0,0,0,1,(int)&colorAttachmentLayoutBarrier,0,0
            );
  endCommandBuffer(vk,local_388.m_data.object);
  submitCommandsAndWait(vk,device,queue,local_388.m_data.object);
  ::vk::invalidateMappedMemoryRange
            (vk,device,
             (VkDeviceMemory)
             ((colorBuffer.m_allocation.
               super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data.ptr)->
             m_memory).m_internal,
             (colorBuffer.m_allocation.
              super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data.ptr)->
             m_offset,bufferSize);
  offsets[0] = (VkDeviceSize)::vk::mapVkFormat(VK_FORMAT_R8G8B8A8_UNORM);
  tcu::ConstPixelBufferAccess::ConstPixelBufferAccess
            ((ConstPixelBufferAccess *)&colorAttachmentLayoutBarrier,(TextureFormat *)offsets,
             resolution.m_data[0],resolution.m_data[1],1,
             (colorBuffer.m_allocation.
              super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data.ptr)->
             m_hostPtr);
  context = (this->super_TestInstance).m_context;
  std::__cxx11::string::string((string *)&local_70,(string *)&this->m_name);
  bVar8 = compareWithFileImage
                    (context,(ConstPixelBufferAccess *)&colorAttachmentLayoutBarrier,&local_70);
  std::__cxx11::string::~string((string *)&local_70);
  if (bVar8) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&colorAttachmentLayoutBarrier,"Pass",(allocator<char> *)offsets);
    tcu::TestStatus::pass(__return_storage_ptr__,(string *)&colorAttachmentLayoutBarrier);
    this_00 = &colorAttachmentLayoutBarrier;
  }
  else {
    std::__cxx11::string::string<std::allocator<char>>((string *)offsets,"Fail",&local_399);
    tcu::TestStatus::fail(__return_storage_ptr__,(string *)offsets);
    this_00 = (VkImageMemoryBarrier *)offsets;
  }
  std::__cxx11::string::~string((string *)this_00);
  geometry::Buffer::~Buffer(&vertexBuffer);
  geometry::Buffer::~Buffer(&colorBuffer);
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)18>_>::~RefBase(&local_248);
  std::__cxx11::string::~string((string *)&geometryShaderName);
  ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::~RefBase(&local_388);
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)24>_>::~RefBase(&local_228);
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)23>_>::~RefBase(&local_208);
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)13>_>::~RefBase(&local_1e8);
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)16>_>::~RefBase
            (&pipelineLayout.super_RefBase<vk::Handle<(vk::HandleType)16>_>);
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)17>_>::~RefBase(&local_328);
  Image::~Image(&colorAttachmentImage);
  return __return_storage_ptr__;
}

Assistant:

tcu::TestStatus GeometryExpanderRenderTestInstance::iterate (void)
{
	const DeviceInterface&			vk						= m_context.getDeviceInterface();
	const VkDevice					device					= m_context.getDevice();
	const deUint32					queueFamilyIndex		= m_context.getUniversalQueueFamilyIndex();
	const VkQueue					queue					= m_context.getUniversalQueue();
	Allocator&						memAlloc				= m_context.getDefaultAllocator();
	const IVec2						resolution				= IVec2(TEST_CANVAS_SIZE, TEST_CANVAS_SIZE);
	const VkFormat					colorFormat				= VK_FORMAT_R8G8B8A8_UNORM;
	const Image						colorAttachmentImage	(
																vk,
																device,
																memAlloc,
																makeImageCreateInfo(resolution, colorFormat, VK_IMAGE_USAGE_COLOR_ATTACHMENT_BIT | VK_BUFFER_USAGE_TRANSFER_SRC_BIT),
																MemoryRequirement::Any
															);
	const Unique<VkRenderPass>		renderPass				(makeRenderPass(vk, device, colorFormat));

	const Move<VkPipelineLayout>	pipelineLayout			(createPipelineLayout(vk, device));
	const VkImageSubresourceRange	colorSubRange			= makeImageSubresourceRange(VK_IMAGE_ASPECT_COLOR_BIT, 0u, 1u, 0u, 1u);
	const Unique<VkImageView>		colorAttachmentView		(makeImageView(vk, device, *colorAttachmentImage, VK_IMAGE_VIEW_TYPE_2D, colorFormat, colorSubRange));
	const Unique<VkFramebuffer>		framebuffer				(makeFramebuffer(vk, device, *renderPass, *colorAttachmentView, resolution.x(), resolution.y(), 1u));
	const Unique<VkCommandPool>		cmdPool					(createCommandPool(vk, device, VK_COMMAND_POOL_CREATE_RESET_COMMAND_BUFFER_BIT, queueFamilyIndex));
	const Unique<VkCommandBuffer>	cmdBuffer				(allocateCommandBuffer(vk, device, *cmdPool, VK_COMMAND_BUFFER_LEVEL_PRIMARY));

	const VkDeviceSize				vertexDataSizeBytes		= sizeInBytes(m_vertexPosData) + sizeInBytes(m_vertexAttrData);
	const deUint32					vertexPositionsOffset	= 0u;
	const deUint32					vertexAtrrOffset		= static_cast<deUint32>(sizeof(Vec4));
	const string					geometryShaderName		= (m_context.getBinaryCollection().contains("geometry_pointsize") && checkPointSize (m_context.getInstanceInterface(), m_context.getPhysicalDevice()))?
																"geometry_pointsize" : "geometry";

	const Unique<VkPipeline>		pipeline				(GraphicsPipelineBuilder()
																.setRenderSize			(resolution)
																.setShader				(vk, device, VK_SHADER_STAGE_VERTEX_BIT, m_context.getBinaryCollection().get("vertex"), DE_NULL)
																.setShader				(vk, device, VK_SHADER_STAGE_GEOMETRY_BIT, m_context.getBinaryCollection().get(geometryShaderName), DE_NULL)
																.setShader				(vk, device, VK_SHADER_STAGE_FRAGMENT_BIT, m_context.getBinaryCollection().get("fragment"), DE_NULL)
																.addVertexBinding		(makeVertexInputBindingDescription(0u, 2u*vertexAtrrOffset, VK_VERTEX_INPUT_RATE_VERTEX))
																.addVertexAttribute		(makeVertexInputAttributeDescription(0u, 0u, VK_FORMAT_R32G32B32A32_SFLOAT, vertexPositionsOffset))
																.addVertexAttribute		(makeVertexInputAttributeDescription(1u, 0u, VK_FORMAT_R32G32B32A32_SFLOAT, vertexAtrrOffset))
																.setPrimitiveTopology	(m_primitiveType)
																.build					(vk, device, *pipelineLayout, *renderPass));

	const VkDeviceSize				colorBufferSizeBytes	= resolution.x()*resolution.y() * tcu::getPixelSize(mapVkFormat(colorFormat));
	const Buffer					colorBuffer				(vk, device, memAlloc, makeBufferCreateInfo(colorBufferSizeBytes,
																VK_BUFFER_USAGE_TRANSFER_DST_BIT), MemoryRequirement::HostVisible);
	const Buffer					vertexBuffer			(vk, device, memAlloc, makeBufferCreateInfo(vertexDataSizeBytes,
																VK_BUFFER_USAGE_VERTEX_BUFFER_BIT ), MemoryRequirement::HostVisible);
	{
		const Allocation& alloc = vertexBuffer.getAllocation();
		struct DataVec4
		{
			Vec4 pos;
			Vec4 color;
		};

		DataVec4* const pData = static_cast<DataVec4*>(alloc.getHostPtr());
		for(int ndx = 0; ndx < m_numDrawVertices; ++ndx)
		{
			pData[ndx].pos = m_vertexPosData[ndx];
			pData[ndx].color = m_vertexAttrData[ndx];
		}
		flushMappedMemoryRange(vk, device, alloc.getMemory(), alloc.getOffset(), vertexDataSizeBytes);
		// No barrier needed, flushed memory is automatically visible
	}

	// Draw commands
	beginCommandBuffer(vk, *cmdBuffer);

	// Change color attachment image layout
	{
		const VkImageMemoryBarrier colorAttachmentLayoutBarrier = makeImageMemoryBarrier(
				(VkAccessFlags)0, VK_ACCESS_COLOR_ATTACHMENT_WRITE_BIT,
				VK_IMAGE_LAYOUT_UNDEFINED, VK_IMAGE_LAYOUT_COLOR_ATTACHMENT_OPTIMAL,
				*colorAttachmentImage, colorSubRange);

		vk.cmdPipelineBarrier(*cmdBuffer, VK_PIPELINE_STAGE_TOP_OF_PIPE_BIT, VK_PIPELINE_STAGE_FRAGMENT_SHADER_BIT, 0u,
						0u, DE_NULL, 0u, DE_NULL, 1u, &colorAttachmentLayoutBarrier);
	}

	// Begin render pass
	{
		const VkRect2D renderArea = {
				makeOffset2D(0, 0),
				makeExtent2D(resolution.x(), resolution.y()),
			};
			const tcu::Vec4 clearColor(0.0f, 0.0f, 0.0f, 1.0f);
			beginRenderPass(vk, *cmdBuffer, *renderPass, *framebuffer, renderArea, clearColor);
	}

	vk.cmdBindPipeline(*cmdBuffer, VK_PIPELINE_BIND_POINT_GRAPHICS, *pipeline);
	{
		const VkBuffer buffers[] = { vertexBuffer.get()};
		const VkDeviceSize offsets[] = { vertexPositionsOffset };
		vk.cmdBindVertexBuffers(*cmdBuffer, 0u, DE_LENGTH_OF_ARRAY(buffers), buffers, offsets);
	}

	bindDescriptorSets(vk, device, memAlloc, *cmdBuffer, *pipelineLayout);

	drawCommand (*cmdBuffer);
	endRenderPass(vk, *cmdBuffer);

	// Copy render result to a host-visible buffer
	{
		const VkImageMemoryBarrier colorAttachmentPreCopyBarrier = makeImageMemoryBarrier(
				VK_ACCESS_COLOR_ATTACHMENT_WRITE_BIT, VK_ACCESS_TRANSFER_READ_BIT,
				VK_IMAGE_LAYOUT_COLOR_ATTACHMENT_OPTIMAL, VK_IMAGE_LAYOUT_TRANSFER_SRC_OPTIMAL,
				*colorAttachmentImage, colorSubRange);

		vk.cmdPipelineBarrier(*cmdBuffer, VK_PIPELINE_STAGE_COLOR_ATTACHMENT_OUTPUT_BIT, VK_PIPELINE_STAGE_TRANSFER_BIT, 0u,
				0u, DE_NULL, 0u, DE_NULL, 1u, &colorAttachmentPreCopyBarrier);
	}
	{
		const VkBufferImageCopy copyRegion = makeBufferImageCopy(makeExtent3D(resolution.x(), resolution.y(), 1), makeImageSubresourceLayers(VK_IMAGE_ASPECT_COLOR_BIT, 0u, 0u, 1u));
		vk.cmdCopyImageToBuffer(*cmdBuffer, *colorAttachmentImage, VK_IMAGE_LAYOUT_TRANSFER_SRC_OPTIMAL, *colorBuffer, 1u, &copyRegion);
	}

	{
		const VkBufferMemoryBarrier postCopyBarrier = makeBufferMemoryBarrier(VK_ACCESS_TRANSFER_WRITE_BIT, VK_ACCESS_HOST_READ_BIT, *colorBuffer, 0ull, colorBufferSizeBytes);

		vk.cmdPipelineBarrier(*cmdBuffer, VK_PIPELINE_STAGE_TRANSFER_BIT, VK_PIPELINE_STAGE_HOST_BIT, 0u,
			0u, DE_NULL, 1u, &postCopyBarrier, 0u, DE_NULL);
	}

	endCommandBuffer(vk, *cmdBuffer);
	submitCommandsAndWait(vk, device, queue, *cmdBuffer);

	{
		// Log the result image.
		const Allocation& colorBufferAlloc = colorBuffer.getAllocation();
		invalidateMappedMemoryRange(vk, device, colorBufferAlloc.getMemory(), colorBufferAlloc.getOffset(), colorBufferSizeBytes);
		const tcu::ConstPixelBufferAccess imagePixelAccess(mapVkFormat(colorFormat), resolution.x(), resolution.y(), 1, colorBufferAlloc.getHostPtr());

		if (!compareWithFileImage(m_context, imagePixelAccess, m_name))
			return TestStatus::fail("Fail");
	}

	return TestStatus::pass("Pass");
}